

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

char * gl4cts::TextureViewUtilities::getInternalformatString(GLenum internalformat)

{
  TestError *this;
  char *local_18;
  char *result;
  GLenum internalformat_local;
  
  if (internalformat == 0x8051) {
    local_18 = "GL_RGB8";
  }
  else if (internalformat == 0x8054) {
    local_18 = "GL_RGB16";
  }
  else if (internalformat == 0x8056) {
    local_18 = "GL_RGBA4";
  }
  else if (internalformat == 0x8057) {
    local_18 = "GL_RGB5_A1";
  }
  else if (internalformat == 0x8058) {
    local_18 = "GL_RGBA8";
  }
  else if (internalformat == 0x8059) {
    local_18 = "GL_RGB10_A2";
  }
  else if (internalformat == 0x805b) {
    local_18 = "GL_RGBA16";
  }
  else if (internalformat == 0x81a5) {
    local_18 = "GL_DEPTH_COMPONENT16";
  }
  else if (internalformat == 0x81a6) {
    local_18 = "GL_DEPTH_COMPONENT24";
  }
  else if (internalformat == 0x8229) {
    local_18 = "GL_R8";
  }
  else if (internalformat == 0x822a) {
    local_18 = "GL_R16";
  }
  else if (internalformat == 0x822b) {
    local_18 = "GL_RG8";
  }
  else if (internalformat == 0x822c) {
    local_18 = "GL_RG16";
  }
  else if (internalformat == 0x822d) {
    local_18 = "GL_R16F";
  }
  else if (internalformat == 0x822e) {
    local_18 = "GL_R32F";
  }
  else if (internalformat == 0x822f) {
    local_18 = "GL_RG16F";
  }
  else if (internalformat == 0x8230) {
    local_18 = "GL_RG32F";
  }
  else if (internalformat == 0x8231) {
    local_18 = "GL_R8I";
  }
  else if (internalformat == 0x8232) {
    local_18 = "GL_R8UI";
  }
  else if (internalformat == 0x8233) {
    local_18 = "GL_R16I";
  }
  else if (internalformat == 0x8234) {
    local_18 = "GL_R16UI";
  }
  else if (internalformat == 0x8235) {
    local_18 = "GL_R32I";
  }
  else if (internalformat == 0x8236) {
    local_18 = "GL_R32UI";
  }
  else if (internalformat == 0x8237) {
    local_18 = "GL_RG8I";
  }
  else if (internalformat == 0x8238) {
    local_18 = "GL_RG8UI";
  }
  else if (internalformat == 0x8239) {
    local_18 = "GL_RG16I";
  }
  else if (internalformat == 0x823a) {
    local_18 = "GL_RG16UI";
  }
  else if (internalformat == 0x823b) {
    local_18 = "GL_RG32I";
  }
  else if (internalformat == 0x823c) {
    local_18 = "GL_RG32UI";
  }
  else if (internalformat == 0x8814) {
    local_18 = "GL_RGBA32F";
  }
  else if (internalformat == 0x8815) {
    local_18 = "GL_RGB32F";
  }
  else if (internalformat == 0x881a) {
    local_18 = "GL_RGBA16F";
  }
  else if (internalformat == 0x881b) {
    local_18 = "GL_RGB16F";
  }
  else if (internalformat == 0x88f0) {
    local_18 = "GL_DEPTH24_STENCIL8";
  }
  else if (internalformat == 0x8c3a) {
    local_18 = "GL_R11F_G11F_B10F";
  }
  else if (internalformat == 0x8c3d) {
    local_18 = "GL_RGB9_E5";
  }
  else if (internalformat == 0x8c41) {
    local_18 = "GL_SRGB8";
  }
  else if (internalformat == 0x8c43) {
    local_18 = "GL_SRGB8_ALPHA8";
  }
  else if (internalformat == 0x8cac) {
    local_18 = "GL_DEPTH_COMPONENT32F";
  }
  else if (internalformat == 0x8cad) {
    local_18 = "GL_DEPTH32F_STENCIL8";
  }
  else if (internalformat == 0x8d62) {
    local_18 = "GL_RGB565";
  }
  else if (internalformat == 0x8d70) {
    local_18 = "GL_RGBA32UI";
  }
  else if (internalformat == 0x8d71) {
    local_18 = "GL_RGB32UI";
  }
  else if (internalformat == 0x8d76) {
    local_18 = "GL_RGBA16UI";
  }
  else if (internalformat == 0x8d77) {
    local_18 = "GL_RGB16UI";
  }
  else if (internalformat == 0x8d7c) {
    local_18 = "GL_RGBA8UI";
  }
  else if (internalformat == 0x8d7d) {
    local_18 = "GL_RGB8UI";
  }
  else if (internalformat == 0x8d82) {
    local_18 = "GL_RGBA32I";
  }
  else if (internalformat == 0x8d83) {
    local_18 = "GL_RGB32I";
  }
  else if (internalformat == 0x8d88) {
    local_18 = "GL_RGBA16I";
  }
  else if (internalformat == 0x8d89) {
    local_18 = "GL_RGB16I";
  }
  else if (internalformat == 0x8d8e) {
    local_18 = "GL_RGBA8I";
  }
  else if (internalformat == 0x8d8f) {
    local_18 = "GL_RGB8I";
  }
  else if (internalformat == 0x8dbb) {
    local_18 = "GL_COMPRESSED_RED_RGTC1";
  }
  else if (internalformat == 0x8dbc) {
    local_18 = "GL_COMPRESSED_SIGNED_RED_RGTC1";
  }
  else if (internalformat == 0x8dbd) {
    local_18 = "GL_COMPRESSED_RG_RGTC2";
  }
  else if (internalformat == 0x8dbe) {
    local_18 = "GL_COMPRESSED_SIGNED_RG_RGTC2";
  }
  else if (internalformat == 0x8e8c) {
    local_18 = "GL_COMPRESSED_RGBA_BPTC_UNORM";
  }
  else if (internalformat == 0x8e8d) {
    local_18 = "GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM";
  }
  else if (internalformat == 0x8e8e) {
    local_18 = "GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT";
  }
  else if (internalformat == 0x8e8f) {
    local_18 = "GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT";
  }
  else if (internalformat == 0x8f94) {
    local_18 = "GL_R8_SNORM";
  }
  else if (internalformat == 0x8f95) {
    local_18 = "GL_RG8_SNORM";
  }
  else if (internalformat == 0x8f96) {
    local_18 = "GL_RGB8_SNORM";
  }
  else if (internalformat == 0x8f97) {
    local_18 = "GL_RGBA8_SNORM";
  }
  else if (internalformat == 0x8f98) {
    local_18 = "GL_R16_SNORM";
  }
  else if (internalformat == 0x8f99) {
    local_18 = "GL_RG16_SNORM";
  }
  else if (internalformat == 0x8f9a) {
    local_18 = "GL_RGB16_SNORM";
  }
  else if (internalformat == 0x8f9b) {
    local_18 = "GL_RGBA16_SNORM";
  }
  else if (internalformat == 0x906f) {
    local_18 = "GL_RGB10_A2UI";
  }
  else if (internalformat == 0x9270) {
    local_18 = "GL_COMPRESSED_R11_EAC";
  }
  else if (internalformat == 0x9271) {
    local_18 = "GL_COMPRESSED_SIGNED_R11_EAC";
  }
  else if (internalformat == 0x9272) {
    local_18 = "GL_COMPRESSED_RG11_EAC";
  }
  else if (internalformat == 0x9273) {
    local_18 = "GL_COMPRESSED_SIGNED_RG11_EAC";
  }
  else if (internalformat == 0x9274) {
    local_18 = "GL_COMPRESSED_RGB8_ETC2";
  }
  else if (internalformat == 0x9275) {
    local_18 = "GL_COMPRESSED_SRGB8_ETC2";
  }
  else if (internalformat == 0x9276) {
    local_18 = "GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2";
  }
  else if (internalformat == 0x9277) {
    local_18 = "GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2";
  }
  else if (internalformat == 0x9278) {
    local_18 = "GL_COMPRESSED_RGBA8_ETC2_EAC";
  }
  else {
    if (internalformat != 0x9279) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Unrecognized internalformat",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x610);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_18 = "GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC";
  }
  return local_18;
}

Assistant:

const char* TextureViewUtilities::getInternalformatString(const glw::GLenum internalformat)
{
	const char* result = "[?]";

	switch (internalformat)
	{
	case GL_RGBA32F:
		result = "GL_RGBA32F";
		break;
	case GL_RGBA32I:
		result = "GL_RGBA32I";
		break;
	case GL_RGBA32UI:
		result = "GL_RGBA32UI";
		break;
	case GL_RGBA16:
		result = "GL_RGBA16";
		break;
	case GL_RGBA16F:
		result = "GL_RGBA16F";
		break;
	case GL_RGBA16I:
		result = "GL_RGBA16I";
		break;
	case GL_RGBA16UI:
		result = "GL_RGBA16UI";
		break;
	case GL_RGBA8:
		result = "GL_RGBA8";
		break;
	case GL_RGBA8I:
		result = "GL_RGBA8I";
		break;
	case GL_RGBA8UI:
		result = "GL_RGBA8UI";
		break;
	case GL_SRGB8_ALPHA8:
		result = "GL_SRGB8_ALPHA8";
		break;
	case GL_RGB10_A2:
		result = "GL_RGB10_A2";
		break;
	case GL_RGB10_A2UI:
		result = "GL_RGB10_A2UI";
		break;
	case GL_RGB5_A1:
		result = "GL_RGB5_A1";
		break;
	case GL_RGBA4:
		result = "GL_RGBA4";
		break;
	case GL_R11F_G11F_B10F:
		result = "GL_R11F_G11F_B10F";
		break;
	case GL_RGB565:
		result = "GL_RGB565";
		break;
	case GL_RG32F:
		result = "GL_RG32F";
		break;
	case GL_RG32I:
		result = "GL_RG32I";
		break;
	case GL_RG32UI:
		result = "GL_RG32UI";
		break;
	case GL_RG16:
		result = "GL_RG16";
		break;
	case GL_RG16F:
		result = "GL_RG16F";
		break;
	case GL_RG16I:
		result = "GL_RG16I";
		break;
	case GL_RG16UI:
		result = "GL_RG16UI";
		break;
	case GL_RG8:
		result = "GL_RG8";
		break;
	case GL_RG8I:
		result = "GL_RG8I";
		break;
	case GL_RG8UI:
		result = "GL_RG8UI";
		break;
	case GL_R32F:
		result = "GL_R32F";
		break;
	case GL_R32I:
		result = "GL_R32I";
		break;
	case GL_R32UI:
		result = "GL_R32UI";
		break;
	case GL_R16F:
		result = "GL_R16F";
		break;
	case GL_R16I:
		result = "GL_R16I";
		break;
	case GL_R16UI:
		result = "GL_R16UI";
		break;
	case GL_R16:
		result = "GL_R16";
		break;
	case GL_R8:
		result = "GL_R8";
		break;
	case GL_R8I:
		result = "GL_R8I";
		break;
	case GL_R8UI:
		result = "GL_R8UI";
		break;
	case GL_RGBA16_SNORM:
		result = "GL_RGBA16_SNORM";
		break;
	case GL_RGBA8_SNORM:
		result = "GL_RGBA8_SNORM";
		break;
	case GL_RGB32F:
		result = "GL_RGB32F";
		break;
	case GL_RGB32I:
		result = "GL_RGB32I";
		break;
	case GL_RGB32UI:
		result = "GL_RGB32UI";
		break;
	case GL_RGB16_SNORM:
		result = "GL_RGB16_SNORM";
		break;
	case GL_RGB16F:
		result = "GL_RGB16F";
		break;
	case GL_RGB16I:
		result = "GL_RGB16I";
		break;
	case GL_RGB16UI:
		result = "GL_RGB16UI";
		break;
	case GL_RGB16:
		result = "GL_RGB16";
		break;
	case GL_RGB8_SNORM:
		result = "GL_RGB8_SNORM";
		break;
	case GL_RGB8:
		result = "GL_RGB8";
		break;
	case GL_RGB8I:
		result = "GL_RGB8I";
		break;
	case GL_RGB8UI:
		result = "GL_RGB8UI";
		break;
	case GL_SRGB8:
		result = "GL_SRGB8";
		break;
	case GL_RGB9_E5:
		result = "GL_RGB9_E5";
		break;
	case GL_RG16_SNORM:
		result = "GL_RG16_SNORM";
		break;
	case GL_RG8_SNORM:
		result = "GL_RG8_SNORM";
		break;
	case GL_R16_SNORM:
		result = "GL_R16_SNORM";
		break;
	case GL_R8_SNORM:
		result = "GL_R8_SNORM";
		break;
	case GL_DEPTH_COMPONENT32F:
		result = "GL_DEPTH_COMPONENT32F";
		break;
	case GL_DEPTH_COMPONENT24:
		result = "GL_DEPTH_COMPONENT24";
		break;
	case GL_DEPTH_COMPONENT16:
		result = "GL_DEPTH_COMPONENT16";
		break;
	case GL_DEPTH32F_STENCIL8:
		result = "GL_DEPTH32F_STENCIL8";
		break;
	case GL_DEPTH24_STENCIL8:
		result = "GL_DEPTH24_STENCIL8";
		break;
	case GL_COMPRESSED_RED_RGTC1:
		result = "GL_COMPRESSED_RED_RGTC1";
		break;
	case GL_COMPRESSED_SIGNED_RED_RGTC1:
		result = "GL_COMPRESSED_SIGNED_RED_RGTC1";
		break;
	case GL_COMPRESSED_RG_RGTC2:
		result = "GL_COMPRESSED_RG_RGTC2";
		break;
	case GL_COMPRESSED_SIGNED_RG_RGTC2:
		result = "GL_COMPRESSED_SIGNED_RG_RGTC2";
		break;
	case GL_COMPRESSED_RGBA_BPTC_UNORM:
		result = "GL_COMPRESSED_RGBA_BPTC_UNORM";
		break;
	case GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM:
		result = "GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM";
		break;
	case GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT:
		result = "GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT";
		break;
	case GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT:
		result = "GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT";
		break;
	case GL_COMPRESSED_RGB8_ETC2:
		result = "GL_COMPRESSED_RGB8_ETC2";
		break;
	case GL_COMPRESSED_SRGB8_ETC2:
		result = "GL_COMPRESSED_SRGB8_ETC2";
		break;
	case GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2:
		result = "GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2";
		break;
	case GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2:
		result = "GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2";
		break;
	case GL_COMPRESSED_RGBA8_ETC2_EAC:
		result = "GL_COMPRESSED_RGBA8_ETC2_EAC";
		break;
	case GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC:
		result = "GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC";
		break;
	case GL_COMPRESSED_R11_EAC:
		result = "GL_COMPRESSED_R11_EAC";
		break;
	case GL_COMPRESSED_SIGNED_R11_EAC:
		result = "GL_COMPRESSED_SIGNED_R11_EAC";
		break;
	case GL_COMPRESSED_RG11_EAC:
		result = "GL_COMPRESSED_RG11_EAC";
		break;
	case GL_COMPRESSED_SIGNED_RG11_EAC:
		result = "GL_COMPRESSED_SIGNED_RG11_EAC";
		break;

	default:
		TCU_FAIL("Unrecognized internalformat");
	}

	return result;
}